

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::cbtSphereCylinderCollisionAlgorithm::getAllContactManifolds
          (cbtSphereCylinderCollisionAlgorithm *this,cbtManifoldArray *manifoldArray)

{
  int iVar1;
  cbtPersistentManifold **ppcVar2;
  long lVar3;
  int iVar4;
  
  if ((this->m_manifoldPtr != (cbtPersistentManifold *)0x0) && (this->m_ownManifold == true)) {
    iVar1 = manifoldArray->m_size;
    if (iVar1 == manifoldArray->m_capacity) {
      iVar4 = 1;
      if (iVar1 != 0) {
        iVar4 = iVar1 * 2;
      }
      if (manifoldArray->m_capacity < iVar4) {
        if (iVar4 == 0) {
          ppcVar2 = (cbtPersistentManifold **)0x0;
        }
        else {
          ppcVar2 = (cbtPersistentManifold **)cbtAlignedAllocInternal((long)iVar4 << 3,0x10);
        }
        iVar1 = manifoldArray->m_size;
        if (0 < (long)iVar1) {
          lVar3 = 0;
          do {
            ppcVar2[lVar3] = manifoldArray->m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar1 != lVar3);
        }
        if (manifoldArray->m_data != (cbtPersistentManifold **)0x0) {
          if (manifoldArray->m_ownsMemory == true) {
            cbtAlignedFreeInternal(manifoldArray->m_data);
          }
          manifoldArray->m_data = (cbtPersistentManifold **)0x0;
        }
        manifoldArray->m_ownsMemory = true;
        manifoldArray->m_data = ppcVar2;
        manifoldArray->m_capacity = iVar4;
      }
    }
    iVar1 = manifoldArray->m_size;
    manifoldArray->m_data[iVar1] = this->m_manifoldPtr;
    manifoldArray->m_size = iVar1 + 1;
  }
  return;
}

Assistant:

void cbtSphereCylinderCollisionAlgorithm::getAllContactManifolds(cbtManifoldArray& manifoldArray) {
    if (m_manifoldPtr && m_ownManifold) {
        manifoldArray.push_back(m_manifoldPtr);
    }
}